

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

double opengv::relative_pose::modules::eigensolver::getSmallestEV
                 (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,
                 Matrix3d *zxF,cayley_t *cayley,Matrix3d *M)

{
  Scalar SVar1;
  double __x;
  Scalar *pSVar2;
  Matrix<double,_3,_3,_0,_3,_3> *in_R9;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *in_stack_00000008;
  double smallestEV;
  double k;
  double w;
  double r;
  double y;
  double beta;
  double alpha;
  double t;
  double s;
  double d;
  double c;
  double b;
  Matrix3d *in_stack_00001dc8;
  Matrix3d *in_stack_00001dd0;
  Matrix3d *in_stack_00001dd8;
  Matrix3d *in_stack_00001de0;
  Matrix3d *in_stack_00001de8;
  Matrix3d *in_stack_00001e00;
  cayley_t *in_stack_00001e08;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *this;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  composeM(in_stack_00001de8,in_stack_00001de0,in_stack_00001dd8,in_stack_00001dd0,in_stack_00001dc8
           ,in_stack_00001e00,in_stack_00001e08);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_00000008,in_R9);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdd7e);
  dVar3 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bddb4);
  dVar4 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bddd9);
  __x = (-dVar3 - dVar4) - *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bde02);
  dVar3 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bde47);
  dVar4 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bde82);
  dVar5 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdebb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdeda);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (-dVar3 - dVar4) - dVar5;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar2;
  auVar6 = vfmadd213sd_fma(auVar6,auVar15,auVar26);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdf09);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdf28);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar6._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = SVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pSVar2;
  auVar6 = vfmadd213sd_fma(auVar7,auVar16,auVar27);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdf58);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdf77);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar6._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *pSVar2;
  auVar6 = vfmadd213sd_fma(auVar8,auVar17,auVar28);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdfaa);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdfca);
  auVar9._0_8_ = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12bdff5);
  dVar3 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12be016);
  dVar4 = pow(*pSVar2,2.0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = SVar1;
  auVar9._8_8_ = 0;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3 * dVar4;
  auVar7 = vfmadd213sd_fma(auVar9,auVar18,auVar29);
  this = in_stack_00000008;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (in_stack_00000008,(Index)in_R9,0x12be061);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be084);
  auVar12._0_8_ = pow(*pSVar2,2.0);
  auVar12._8_56_ = extraout_var;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar7._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = SVar1;
  auVar7 = vfmadd213sd_fma(auVar12._0_16_,auVar19,auVar30);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be0c6);
  dVar3 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be0e8);
  dVar4 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be113);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar7._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *pSVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -(dVar3 * dVar4);
  auVar7 = vfmadd213sd_fma(auVar10,auVar20,auVar31);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be164);
  dVar3 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be190);
  dVar4 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)in_R9,0x12be1bc);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar7._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *pSVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -(dVar3 * 2.0 * dVar4);
  auVar7 = vfmadd213sd_fma(auVar11,auVar21,auVar32);
  auVar13._0_8_ = pow(__x,3.0);
  auVar13._8_56_ = extraout_var_00;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -(__x * 9.0 * auVar6._0_8_);
  auVar8 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar13._0_16_,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar7._0_8_;
  auVar7 = vfmadd213sd_fma(ZEXT816(0x403b000000000000),auVar23,auVar8);
  auVar14._0_8_ = pow(__x,2.0);
  auVar14._8_56_ = extraout_var_01;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar6._0_8_;
  auVar6 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar24,auVar14._0_16_);
  dVar3 = pow(auVar6._0_8_,3.0);
  dVar4 = sqrt(dVar3 * 4.0);
  dVar4 = acos(auVar7._0_8_ / dVar4);
  dVar4 = cos(dVar4 / 3.0);
  dVar3 = sqrt(dVar3 * 4.0);
  dVar3 = pow(dVar3 * 0.5,0.3333333333333333);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3 * dVar4;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = -__x;
  auVar6 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar25,auVar33);
  return auVar6._0_8_ / 3.0;
}

Assistant:

double
opengv::relative_pose::modules::eigensolver::getSmallestEV(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const cayley_t & cayley,
    Eigen::Matrix3d & M )
{
  M = composeM(xxF,yyF,zzF,xyF,yzF,zxF,cayley);

  //Retrieve the smallest Eigenvalue by the following closed form solution
  double b = -M(0,0)-M(1,1)-M(2,2);
  double c =
      -pow(M(0,2),2)-pow(M(1,2),2)-pow(M(0,1),2)+
      M(0,0)*M(1,1)+M(0,0)*M(2,2)+M(1,1)*M(2,2);
  double d =
      M(1,1)*pow(M(0,2),2)+M(0,0)*pow(M(1,2),2)+M(2,2)*pow(M(0,1),2)-
      M(0,0)*M(1,1)*M(2,2)-2*M(0,1)*M(1,2)*M(0,2);

  double s = 2*pow(b,3)-9*b*c+27*d;
  double t = 4*pow((pow(b,2)-3*c),3);

  double alpha = acos(s/sqrt(t));
  double beta = alpha/3;
  double y = cos(beta);

  double r = 0.5*sqrt(t);
  double w = pow(r,(1.0/3.0));

  double k = w*y;
  double smallestEV = (-b-2*k)/3;
  return smallestEV;
}